

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# image_buffer.h
# Opt level: O3

void __thiscall PenguinV_Image::ImageTemplate<double>::clear(ImageTemplate<double> *this)

{
  double *pdVar1;
  FunctionFacade *this_00;
  _func_void_double_ptr *p_Var2;
  
  pdVar1 = this->_data;
  if (pdVar1 != (double *)0x0) {
    this_00 = FunctionFacade::instance();
    p_Var2 = __PenguinV_Image__ImageTemplate<double>__FunctionFacade___getFunction<void(*)(double*)>_std__vector<void(*)(double*),std::allocator<void(*)(double*)>>const__unsigned_char_const_
                       (this_00,&this_00->_deallocate,this->_type);
    (*p_Var2)(pdVar1);
    this->_data = (double *)0x0;
  }
  this->_width = 0;
  this->_height = 0;
  this->_rowSize = 0;
  return;
}

Assistant:

void clear()
        {
            if( _data != nullptr ) {
                _deallocate( _data );
                _data = nullptr;
            }

            _width   = 0;
            _height  = 0;
            _rowSize = 0;
        }